

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

IResultCapture * Catch::getResultCapture(void)

{
  Context *this;
  ReusableStringStream *pRVar1;
  SourceLineInfo local_50;
  ReusableStringStream local_40;
  string local_30;
  IResultCapture *local_10;
  IResultCapture *capture;
  
  this = getCurrentContext();
  local_10 = Context::getResultCapture(this);
  if (local_10 != (IResultCapture *)0x0) {
    return local_10;
  }
  ReusableStringStream::ReusableStringStream(&local_40);
  SourceLineInfo::SourceLineInfo
            (&local_50,
             "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp"
             ,0x166f);
  pRVar1 = ReusableStringStream::operator<<(&local_40,&local_50);
  pRVar1 = ReusableStringStream::operator<<(pRVar1,(char (*) [26])": Internal Catch2 error: ");
  pRVar1 = ReusableStringStream::operator<<(pRVar1,(char (*) [27])"No result capture instance");
  ReusableStringStream::str_abi_cxx11_(&local_30,pRVar1);
  throw_logic_error(&local_30);
}

Assistant:

IResultCapture& getResultCapture() {
        if (auto* capture = getCurrentContext().getResultCapture())
            return *capture;
        else
            CATCH_INTERNAL_ERROR("No result capture instance");
    }